

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# akarin_timer.cpp
# Opt level: O0

float AkarinTimer::get_delta_time(void)

{
  int iVar1;
  rep_conflict rVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  duration<float,_std::ratio<1L,_1L>_> local_14;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_10;
  duration<float,_std::ratio<1L,_1L>_> elapsed_seconds;
  time_point end;
  
  if (get_delta_time()::start_time == '\0') {
    iVar1 = __cxa_guard_acquire(&get_delta_time()::start_time);
    if (iVar1 != 0) {
      get_delta_time::start_time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      __cxa_guard_release(&get_delta_time()::start_time);
    }
  }
  tStack_10.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20.__r = (rep)std::chrono::operator-(&stack0xfffffffffffffff0,&get_delta_time::start_time);
  std::chrono::duration<float,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<float,std::ratio<1l,1l>> *)&local_14,&local_20);
  get_delta_time::start_time.__d.__r = tStack_10.__d.__r;
  rVar2 = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&local_14);
  return rVar2;
}

Assistant:

float AkarinTimer::get_delta_time() noexcept
{
    static auto start_time = std::chrono::high_resolution_clock::now();
    auto end = std::chrono::high_resolution_clock::now();
    std::chrono::duration<float> elapsed_seconds = end - start_time;
    start_time = end;
    return elapsed_seconds.count();
}